

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O1

void Cec_SetActivityFactors_rec(Cec_ManSat_t *p,Gia_Obj_t *pObj,int LevelMin,int LevelMax)

{
  uint uVar1;
  Gia_Man_t *pGVar2;
  Gia_Obj_t *pGVar3;
  sat_solver *psVar4;
  int iVar5;
  int *piVar6;
  int iVar7;
  
  while( true ) {
    pGVar2 = p->pAig;
    pGVar3 = pGVar2->pObjs;
    if ((pObj < pGVar3) || (pGVar3 + pGVar2->nObjs <= pObj)) break;
    iVar7 = (int)((long)pObj - (long)pGVar3 >> 2) * -0x55555555;
    if (pGVar2->nTravIdsAlloc <= iVar7) {
      __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x264,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
    }
    if (pGVar2->pTravIds[iVar7] == pGVar2->nTravIds) {
      return;
    }
    pGVar2->pTravIds[iVar7] = pGVar2->nTravIds;
    iVar7 = Gia_ObjLevel(pGVar2,pObj);
    if (iVar7 <= LevelMin) {
      return;
    }
    if ((~*(uint *)pObj & 0x9fffffff) == 0) {
      return;
    }
    pGVar2 = p->pAig;
    pGVar3 = pGVar2->pObjs;
    if ((pObj < pGVar3) || (pGVar3 + pGVar2->nObjs <= pObj)) break;
    iVar7 = p->pSatVars[(int)((ulong)((long)pObj - (long)pGVar3) >> 2) * -0x55555555];
    if ((long)iVar7 != 0) {
      iVar5 = Gia_ObjLevel(pGVar2,pObj);
      psVar4 = p->pSat;
      psVar4->factors[iVar7] =
           (double)(((float)(iVar5 - LevelMin) * 20.0) / (float)(LevelMax - LevelMin));
      uVar1 = (psVar4->act_vars).cap;
      if ((psVar4->act_vars).size == uVar1) {
        iVar5 = (uVar1 >> 1) * 3;
        if ((int)uVar1 < 4) {
          iVar5 = uVar1 * 2;
        }
        piVar6 = (psVar4->act_vars).ptr;
        if (piVar6 == (int *)0x0) {
          piVar6 = (int *)malloc((long)iVar5 << 2);
        }
        else {
          piVar6 = (int *)realloc(piVar6,(long)iVar5 << 2);
        }
        (psVar4->act_vars).ptr = piVar6;
        if (piVar6 == (int *)0x0) {
          printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                 (double)(psVar4->act_vars).cap * 9.5367431640625e-07,
                 (double)iVar5 * 9.5367431640625e-07);
          fflush(_stdout);
        }
        (psVar4->act_vars).cap = iVar5;
      }
      iVar5 = (psVar4->act_vars).size;
      (psVar4->act_vars).size = iVar5 + 1;
      (psVar4->act_vars).ptr[iVar5] = iVar7;
    }
    Cec_SetActivityFactors_rec(p,pObj + -(*(ulong *)pObj & 0x1fffffff),LevelMin,LevelMax);
    pObj = pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff);
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Cec_SetActivityFactors_rec( Cec_ManSat_t * p, Gia_Obj_t * pObj, int LevelMin, int LevelMax )
{
    float dActConeBumpMax = 20.0;
    int iVar;
    // skip visited variables
    if ( Gia_ObjIsTravIdCurrent(p->pAig, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p->pAig, pObj);
    // add the PI to the list
    if ( Gia_ObjLevel(p->pAig, pObj) <= LevelMin || Gia_ObjIsCi(pObj) )
        return;
    // set the factor of this variable
    // (LevelMax-LevelMin) / (pObj->Level-LevelMin) = p->pPars->dActConeBumpMax / ThisBump
    if ( (iVar = Cec_ObjSatNum(p,pObj)) )
    {
        p->pSat->factors[iVar] = dActConeBumpMax * (Gia_ObjLevel(p->pAig, pObj) - LevelMin)/(LevelMax - LevelMin);
        veci_push(&p->pSat->act_vars, iVar);
    }
    // explore the fanins
    Cec_SetActivityFactors_rec( p, Gia_ObjFanin0(pObj), LevelMin, LevelMax );
    Cec_SetActivityFactors_rec( p, Gia_ObjFanin1(pObj), LevelMin, LevelMax );
}